

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_specialization_constants_and_structs(CompilerMSL *this)

{
  ParsedIR *this_00;
  bool bVar1;
  uint uVar2;
  Types TVar3;
  ID id;
  BaseType BVar4;
  size_t sVar5;
  Variant *pVVar6;
  _Hash_node_base *p_Var7;
  __node_base _Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  uint32_t uVar13;
  ExecutionModel EVar14;
  uint32_t uVar15;
  SPIREntryPoint *pSVar16;
  SPIRType *pSVar17;
  SPIRConstant *pSVar18;
  const_iterator cVar19;
  SPIRUndef *pSVar20;
  SPIRVariable *pSVar21;
  SPIRConstantOp *pSVar22;
  mapped_type *pmVar23;
  SPIRType *pSVar24;
  long *plVar25;
  size_type *psVar26;
  ulong uVar27;
  string *ts_1;
  _Alloc_hider _Var28;
  __hash_code __code;
  TypedID<(spirv_cross::Types)0> *pTVar29;
  long lVar30;
  TypedID<(spirv_cross::Types)0> *pTVar31;
  uint32_t constant_id_1;
  string sc_tmp_name;
  string sc_type_name;
  string sc_name;
  uint32_t constant_id;
  undefined4 uStack_14c;
  char local_140 [16];
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
  unique_func_constants;
  LoopLock loop_lock;
  __hashtable *__h;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  declared_structs;
  string local_a0;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  aligned_structs;
  
  wg_x.id.id = 0;
  wg_y.id.id = 0;
  wg_z.id.id = 0;
  uVar13 = Compiler::get_work_group_size_specialization_constants
                     ((Compiler *)this,&wg_x,&wg_y,&wg_z);
  if ((uVar13 == 0) &&
     (EVar14 = Compiler::get_execution_model((Compiler *)this), EVar14 == ExecutionModelMeshEXT)) {
    pSVar16 = Compiler::get_entry_point((Compiler *)this);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &declared_structs,this,0x19,4);
    CompilerGLSL::
    statement<char_const(&)[16],std::__cxx11::string,char_const(&)[21],char_const(&)[7],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [16])"constant uint3 ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &declared_structs,(char (*) [21])" [[maybe_unused]] = ",(char (*) [7])0x2d43eb,
               &(pSVar16->workgroup_size).x,(char (*) [3])0x2d07c3,&(pSVar16->workgroup_size).y,
               (char (*) [3])0x2d07c3,&(pSVar16->workgroup_size).z,(char (*) [3])0x2b977c);
    if ((__node_base *)declared_structs._M_h._M_buckets != &declared_structs._M_h._M_before_begin) {
      operator_delete(declared_structs._M_h._M_buckets);
    }
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2aec75);
  }
  declared_structs._M_h._M_buckets = &declared_structs._M_h._M_single_bucket;
  declared_structs._M_h._M_bucket_count = 1;
  declared_structs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  declared_structs._M_h._M_element_count = 0;
  declared_structs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  declared_structs._M_h._M_rehash_policy._M_next_resize = 0;
  declared_structs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  aligned_structs._M_h._M_buckets = &aligned_structs._M_h._M_single_bucket;
  aligned_structs._M_h._M_bucket_count = 1;
  aligned_structs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  aligned_structs._M_h._M_element_count = 0;
  aligned_structs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  aligned_structs._M_h._M_rehash_policy._M_next_resize = 0;
  aligned_structs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar29 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar30 = 0;
    do {
      uVar2 = *(uint *)((long)&pTVar29->id + lVar30);
      pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (((pVVar6[uVar2].type == TypeType) &&
          (pSVar17 = Variant::get<spirv_cross::SPIRType>(pVVar6 + uVar2),
          pSVar17->basetype == Struct)) &&
         (bVar9 = Compiler::has_extended_decoration
                            ((Compiler *)this,uVar2,SPIRVCrossDecorationBufferBlockRepacked), bVar9)
         ) {
        mark_scalar_layout_structs(this,pSVar17);
      }
      lVar30 = lVar30 + 4;
    } while (sVar5 << 2 != lVar30);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&unique_func_constants);
  EVar14 = Compiler::get_execution_model((Compiler *)this);
  bVar9 = EVar14 == ExecutionModelMeshEXT;
  ParsedIR::create_loop_hard_lock(this_00);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar29 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar30 = 0;
    do {
      uVar2 = *(uint *)((long)&pTVar29->id + lVar30);
      pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar6[uVar2].type == TypeConstant) {
        pSVar18 = Variant::get<spirv_cross::SPIRConstant>(pVVar6 + uVar2);
        pSVar17 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar18->super_IVariant).field_0xc);
        bVar10 = Compiler::is_array((Compiler *)this,pSVar17);
        if ((bVar10) &&
           (bVar10 = Compiler::has_decoration
                               ((Compiler *)this,(ID)(pSVar17->super_IVariant).self.id,
                                DecorationBlock), bVar10)) {
          bVar10 = Compiler::is_builtin_type((Compiler *)this,pSVar17);
          bVar9 = (bool)(bVar9 | bVar10);
        }
      }
      lVar30 = lVar30 + 4;
    } while (sVar5 << 2 != lVar30);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&unique_func_constants);
  ParsedIR::create_loop_soft_lock(this_00);
  ParsedIR::create_loop_hard_lock(this_00);
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 == 0) {
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&sc_type_name);
    _Var8 = declared_structs._M_h._M_before_begin;
  }
  else {
    pTVar29 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar31 = pTVar29 + sVar5;
    bVar10 = false;
    do {
      while( true ) {
        pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if (((pVVar6[pTVar29->id].type == TypeType) &&
            (pSVar17 = Variant::get<spirv_cross::SPIRType>(pVVar6 + pTVar29->id),
            pSVar17->basetype == Struct)) &&
           ((pSVar17->pointer == true && (pSVar17->storage == StorageClassPhysicalStorageBuffer))))
        break;
LAB_001fc157:
        pTVar29 = pTVar29 + 1;
        if (pTVar29 == pTVar31) {
          ParsedIR::LoopLock::~LoopLock((LoopLock *)&sc_type_name);
          _Var8 = declared_structs._M_h._M_before_begin;
          if (!bVar10) goto joined_r0x001fc229;
          goto LAB_001fc200;
        }
      }
      unique_func_constants._M_h._M_buckets =
           (__buckets_ptr)
           CONCAT44(unique_func_constants._M_h._M_buckets._4_4_,(pSVar17->super_IVariant).self.id);
      cVar19 = ::std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&declared_structs._M_h,(key_type *)&unique_func_constants);
      if (cVar19.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
      goto LAB_001fc157;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &unique_func_constants,this,(ulong)(pSVar17->super_IVariant).self.id,1);
      CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [8])"struct ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &unique_func_constants,(char (*) [2])0x2d3bdb);
      if ((__node_base *)unique_func_constants._M_h._M_buckets !=
          &unique_func_constants._M_h._M_before_begin) {
        operator_delete(unique_func_constants._M_h._M_buckets);
      }
      sc_name._M_dataplus._M_p._0_4_ = (pSVar17->super_IVariant).self.id;
      unique_func_constants._M_h._M_buckets = (__buckets_ptr)&declared_structs;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)unique_func_constants._M_h._M_buckets,&sc_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &unique_func_constants);
      pTVar29 = pTVar29 + 1;
      bVar10 = true;
    } while (pTVar29 != pTVar31);
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&sc_type_name);
LAB_001fc200:
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2aec75);
    _Var8 = declared_structs._M_h._M_before_begin;
  }
joined_r0x001fc229:
  while (_Var8._M_nxt != (_Hash_node_base *)0x0) {
    p_Var7 = (_Var8._M_nxt)->_M_nxt;
    operator_delete(_Var8._M_nxt);
    _Var8._M_nxt = p_Var7;
  }
  memset(declared_structs._M_h._M_buckets,0,declared_structs._M_h._M_bucket_count << 3);
  declared_structs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  declared_structs._M_h._M_element_count = 0;
  unique_func_constants._M_h._M_buckets = &unique_func_constants._M_h._M_single_bucket;
  unique_func_constants._M_h._M_bucket_count = 1;
  unique_func_constants._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unique_func_constants._M_h._M_element_count = 0;
  unique_func_constants._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unique_func_constants._M_h._M_rehash_policy._M_next_resize = 0;
  unique_func_constants._M_h._M_single_bucket = (__node_base_ptr)0x0;
  sVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar31 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar29 = pTVar31 + sVar5;
    bVar10 = false;
    do {
      pVVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr + pTVar31->id;
      TVar3 = pVVar6->type;
      if ((int)TVar3 < 9) {
        if (TVar3 == TypeType) {
          pSVar17 = Variant::get<spirv_cross::SPIRType>(pVVar6);
          id.id = (pSVar17->super_IVariant).self.id;
          BVar4 = pSVar17->basetype;
          sVar5 = (pSVar17->array).super_VectorView<unsigned_int>.buffer_size;
          bVar1 = pSVar17->pointer;
          bVar11 = Compiler::has_decoration((Compiler *)this,id,DecorationBlock);
          if (bVar11) {
LAB_001fc51a:
            bVar11 = Compiler::is_builtin_type((Compiler *)this,pSVar17);
            bVar12 = !bVar11 | bVar9;
          }
          else {
            bVar11 = Compiler::has_decoration
                               ((Compiler *)this,(ID)(pSVar17->super_IVariant).self.id,
                                DecorationBufferBlock);
            bVar12 = 1;
            if (bVar11) goto LAB_001fc51a;
          }
          bVar12 = (((BVar4 != Struct || sVar5 != 0) | bVar1) ^ 1U) & bVar12;
          uVar27 = (ulong)(this->stage_out_var_id).id;
          if (uVar27 != 0) {
            pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar27);
            pSVar24 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
            bVar12 = bVar12 & (pSVar24->super_IVariant).self.id != id.id;
          }
          uVar27 = (ulong)(this->patch_stage_out_var_id).id;
          if (uVar27 != 0) {
            pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar27);
            pSVar24 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
            bVar12 = bVar12 & (pSVar24->super_IVariant).self.id != id.id;
          }
          uVar27 = (ulong)(this->stage_in_var_id).id;
          if (uVar27 != 0) {
            pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar27);
            pSVar24 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
            bVar12 = bVar12 & (pSVar24->super_IVariant).self.id != id.id;
          }
          uVar27 = (ulong)(this->patch_stage_in_var_id).id;
          if (uVar27 != 0) {
            pSVar21 = Variant::get<spirv_cross::SPIRVariable>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar27);
            pSVar24 = Compiler::get_variable_data_type((Compiler *)this,pSVar21);
            bVar12 = bVar12 & (pSVar24->super_IVariant).self.id != id.id;
          }
          if (((this->stage_out_masked_builtin_type_id).id == id.id) || (bVar12 != 0)) {
            uVar27 = (ulong)id.id % declared_structs._M_h._M_bucket_count;
            if (declared_structs._M_h._M_buckets[uVar27] != (__node_base_ptr)0x0) {
              p_Var7 = declared_structs._M_h._M_buckets[uVar27]->_M_nxt;
              uVar15 = *(uint32_t *)&p_Var7[1]._M_nxt;
              do {
                if (id.id == uVar15) goto LAB_001fc650;
                p_Var7 = p_Var7->_M_nxt;
              } while ((p_Var7 != (_Hash_node_base *)0x0) &&
                      (uVar15 = *(uint32_t *)&p_Var7[1]._M_nxt,
                      (ulong)uVar15 % declared_structs._M_h._M_bucket_count == uVar27));
            }
            if (bVar10) {
              CompilerGLSL::statement<char_const(&)[1]>
                        (&this->super_CompilerGLSL,(char (*) [1])0x2aec75);
            }
            sc_type_name._M_dataplus._M_p = (pointer)&declared_structs;
            sc_name._M_dataplus._M_p._0_4_ = id.id;
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)sc_type_name._M_dataplus._M_p,&sc_name,&sc_type_name);
            bVar10 = Compiler::has_extended_decoration
                               ((Compiler *)this,id.id,SPIRVCrossDecorationBufferBlockRepacked);
            if (bVar10) {
              align_struct(this,pSVar17,&aligned_structs);
            }
            pSVar17 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + id.id);
            CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar17);
            bVar10 = false;
          }
        }
        else if (TVar3 == TypeConstant) {
          pSVar18 = Variant::get<spirv_cross::SPIRConstant>(pVVar6);
          if ((pSVar18->super_IVariant).self.id == uVar13) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&sc_type_name,this,0x19);
            pSVar18 = Variant::get<spirv_cross::SPIRConstant>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + uVar13);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&sc_name,&this->super_CompilerGLSL,pSVar18,false,false);
            CompilerGLSL::
            statement<char_const(&)[16],std::__cxx11::string,char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [16])"constant uint3 ",&sc_type_name,
                       (char (*) [21])" [[maybe_unused]] = ",&sc_name,(char (*) [2])0x2d3bdb);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_) !=
                &sc_name.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_
                                      ));
            }
            goto joined_r0x001fc646;
          }
          if (pSVar18->specialization == true) {
            pSVar17 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)&(pSVar18->super_IVariant).field_0xc);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&sc_type_name,this,pSVar17,0);
            CompilerGLSL::add_resource_name
                      (&this->super_CompilerGLSL,(pSVar18->super_IVariant).self.id);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&sc_name,this,(ulong)(pSVar18->super_IVariant).self.id);
            if ((((this->msl_options).msl_version < 0x27d8) ||
                (bVar10 = Compiler::has_decoration
                                    ((Compiler *)this,(ID)(pSVar18->super_IVariant).self.id,
                                     DecorationSpecId), !bVar10)) ||
               (pSVar18->is_used_as_array_length != false)) {
              bVar10 = Compiler::has_decoration
                                 ((Compiler *)this,(ID)(pSVar18->super_IVariant).self.id,
                                  DecorationSpecId);
              if (bVar10) {
                uVar15 = Compiler::get_decoration
                                   ((Compiler *)this,(ID)(pSVar18->super_IVariant).self.id,
                                    DecorationSpecId);
                constant_id = uVar15;
                CompilerGLSL::constant_value_macro_name_abi_cxx11_
                          (&sc_tmp_name,&this->super_CompilerGLSL,uVar15);
                ts_1 = &pSVar18->specialization_constant_macro_name;
                ::std::__cxx11::string::operator=((string *)ts_1,(string *)&sc_tmp_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) {
                  operator_delete(sc_tmp_name._M_dataplus._M_p);
                }
                CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                          (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",ts_1);
                CompilerGLSL::constant_expression_abi_cxx11_
                          (&sc_tmp_name,&this->super_CompilerGLSL,pSVar18,false,false);
                CompilerGLSL::
                statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                          (&this->super_CompilerGLSL,(char (*) [9])"#define ",ts_1,
                           (char (*) [2])0x2bb1d1,&sc_tmp_name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) {
                  operator_delete(sc_tmp_name._M_dataplus._M_p);
                }
                CompilerGLSL::statement<char_const(&)[7]>
                          (&this->super_CompilerGLSL,(char (*) [7])"#endif");
                CompilerGLSL::
                statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                          (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                           (char (*) [2])0x2bb1d1,&sc_name,(char (*) [4])0x2d3d47,ts_1,
                           (char (*) [2])0x2d3bdb);
                sc_tmp_name._M_dataplus._M_p = (pointer)&this->constant_macro_ids;
                ::std::
                _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                          ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&this->constant_macro_ids,&constant_id,&sc_tmp_name);
              }
              else {
                CompilerGLSL::constant_expression_abi_cxx11_
                          (&sc_tmp_name,&this->super_CompilerGLSL,pSVar18,false,false);
                CompilerGLSL::
                statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                          (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                           (char (*) [2])0x2bb1d1,&sc_name,(char (*) [4])0x2d3d47,&sc_tmp_name,
                           (char (*) [2])0x2d3bdb);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) goto LAB_001fcc84;
              }
            }
            else {
              constant_id_1 =
                   Compiler::get_decoration
                             ((Compiler *)this,(ID)(pSVar18->super_IVariant).self.id,
                              DecorationSpecId);
              if (unique_func_constants._M_h._M_buckets
                  [(ulong)constant_id_1 % unique_func_constants._M_h._M_bucket_count] !=
                  (__node_base_ptr)0x0) {
                p_Var7 = unique_func_constants._M_h._M_buckets
                         [(ulong)constant_id_1 % unique_func_constants._M_h._M_bucket_count]->_M_nxt
                ;
                uVar2 = *(uint *)&p_Var7[1]._M_nxt;
                do {
                  if (constant_id_1 == uVar2) goto LAB_001fcaa5;
                  p_Var7 = p_Var7->_M_nxt;
                } while ((p_Var7 != (_Hash_node_base *)0x0) &&
                        (uVar2 = *(uint *)&p_Var7[1]._M_nxt,
                        (ulong)uVar2 % unique_func_constants._M_h._M_bucket_count ==
                        (ulong)constant_id_1 % unique_func_constants._M_h._M_bucket_count));
              }
              sc_tmp_name._M_dataplus._M_p =
                   (pointer)CONCAT44((pSVar18->super_IVariant).self.id,constant_id_1);
              ::std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)0>>>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&unique_func_constants,&sc_tmp_name);
LAB_001fcaa5:
              pmVar23 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&unique_func_constants,&constant_id_1);
              pSVar24 = Compiler::expression_type((Compiler *)this,pmVar23->id);
              BVar4 = pSVar24->basetype;
              pmVar23 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&unique_func_constants,&constant_id_1);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (&constant_id,this,(ulong)pmVar23->id,1);
              plVar25 = (long *)::std::__cxx11::string::append((char *)&constant_id);
              sc_tmp_name._M_dataplus._M_p = (pointer)&sc_tmp_name.field_2;
              psVar26 = (size_type *)(plVar25 + 2);
              if ((size_type *)*plVar25 == psVar26) {
                sc_tmp_name.field_2._M_allocated_capacity = *psVar26;
                sc_tmp_name.field_2._8_8_ = plVar25[3];
              }
              else {
                sc_tmp_name.field_2._M_allocated_capacity = *psVar26;
                sc_tmp_name._M_dataplus._M_p = (pointer)*plVar25;
              }
              sc_tmp_name._M_string_length = plVar25[1];
              *plVar25 = (long)psVar26;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              if (_constant_id != local_140) {
                operator_delete(_constant_id);
              }
              pmVar23 = ::std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&unique_func_constants,&constant_id_1);
              if (pmVar23->id == (pSVar18->super_IVariant).self.id) {
                CompilerGLSL::
                statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[22],unsigned_int&,char_const(&)[5]>
                          (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                           (char (*) [2])0x2bb1d1,&sc_tmp_name,(char (*) [22])0x2c766d,
                           &constant_id_1,(char (*) [5])")]];");
              }
              CompilerGLSL::bitcast_expression
                        ((string *)&constant_id,&this->super_CompilerGLSL,pSVar17,BVar4,&sc_tmp_name
                        );
              CompilerGLSL::constant_expression_abi_cxx11_
                        (&local_a0,&this->super_CompilerGLSL,pSVar18,false,false);
              CompilerGLSL::
              statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[33],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                        (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_type_name,
                         (char (*) [2])0x2bb1d1,&sc_name,
                         (char (*) [33])" = is_function_constant_defined(",&sc_tmp_name,
                         (char (*) [5])0x2c76f1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &constant_id,(char (*) [4])0x2c1b24,&local_a0,(char (*) [2])0x2d3bdb);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
              if (_constant_id != local_140) {
                operator_delete(_constant_id);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) {
LAB_001fcc84:
                operator_delete(sc_tmp_name._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_) !=
                &sc_name.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_
                                      ));
            }
            goto joined_r0x001fc646;
          }
        }
      }
      else {
        if (TVar3 == TypeConstantOp) {
          pSVar22 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar6);
          pSVar17 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + (pSVar22->basetype).id);
          CompilerGLSL::add_resource_name
                    (&this->super_CompilerGLSL,(pSVar22->super_IVariant).self.id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&sc_type_name,this,(ulong)(pSVar22->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&sc_name,this,pSVar17,&sc_type_name,0);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])
                    (&sc_tmp_name,this,pSVar22);
          CompilerGLSL::
          statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [10])"constant ",&sc_name,
                     (char (*) [4])0x2d3d47,&sc_tmp_name,(char (*) [2])0x2d3bdb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) {
            operator_delete(sc_tmp_name._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_) !=
              &sc_name.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_))
            ;
          }
joined_r0x001fc646:
          _Var28._M_p = sc_type_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sc_type_name._M_dataplus._M_p != &sc_type_name.field_2) {
LAB_001fc648:
            operator_delete(_Var28._M_p);
          }
        }
        else {
          if (TVar3 != TypeUndef) goto LAB_001fc650;
          pSVar20 = Variant::get<spirv_cross::SPIRUndef>(pVVar6);
          pSVar17 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar20->super_IVariant).field_0xc);
          if (pSVar17->basetype == Void) goto LAB_001fccc5;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&sc_tmp_name,this,(ulong)(pSVar20->super_IVariant).self.id,1);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                    (&sc_name,this,pSVar17,&sc_tmp_name);
          _constant_id = local_140;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&constant_id,"constant","");
          inject_top_level_storage_qualifier(&sc_type_name,&sc_name,(string *)&constant_id);
          CompilerGLSL::statement<std::__cxx11::string,char_const(&)[7]>
                    (&this->super_CompilerGLSL,&sc_type_name,(char (*) [7])0x2d3a76);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sc_type_name._M_dataplus._M_p != &sc_type_name.field_2) {
            operator_delete(sc_type_name._M_dataplus._M_p);
          }
          if (_constant_id != local_140) {
            operator_delete(_constant_id);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_) !=
              &sc_name.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(sc_name._M_dataplus._M_p._4_4_,sc_name._M_dataplus._M_p._0_4_))
            ;
          }
          _Var28._M_p = sc_tmp_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sc_tmp_name._M_dataplus._M_p != &sc_tmp_name.field_2) goto LAB_001fc648;
        }
        bVar10 = true;
      }
LAB_001fc650:
      pTVar31 = pTVar31 + 1;
    } while (pTVar31 != pTVar29);
    if (bVar10) {
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2aec75);
    }
  }
LAB_001fccc5:
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&unique_func_constants._M_h);
  ParsedIR::LoopLock::~LoopLock(&loop_lock);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&aligned_structs._M_h);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&declared_structs._M_h);
  return;
}

Assistant:

void CompilerMSL::emit_specialization_constants_and_structs()
{
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);
	if (workgroup_size_id == 0 && is_mesh_shader())
	{
		auto &execution = get_entry_point();
		statement("constant uint3 ", builtin_to_glsl(BuiltInWorkgroupSize, StorageClassWorkgroup),
		          " [[maybe_unused]] = ", "uint3(", execution.workgroup_size.x, ", ", execution.workgroup_size.y, ", ",
		          execution.workgroup_size.z, ");");
		statement("");
	}

	bool emitted = false;
	unordered_set<uint32_t> declared_structs;
	unordered_set<uint32_t> aligned_structs;

	// First, we need to deal with scalar block layout.
	// It is possible that a struct may have to be placed at an alignment which does not match the innate alignment of the struct itself.
	// In that case, if such a case exists for a struct, we must force that all elements of the struct become packed_ types.
	// This makes the struct alignment as small as physically possible.
	// When we actually align the struct later, we can insert padding as necessary to make the packed members behave like normally aligned types.
	ir.for_each_typed_id<SPIRType>([&](uint32_t type_id, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
		    has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
			mark_scalar_layout_structs(type);
	});

	bool builtin_block_type_is_required = is_mesh_shader();
	// Very special case. If gl_PerVertex is initialized as an array (tessellation)
	// we have to potentially emit the gl_PerVertex struct type so that we can emit a constant LUT.
	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		auto &type = this->get<SPIRType>(c.constant_type);
		if (is_array(type) && has_decoration(type.self, DecorationBlock) && is_builtin_type(type))
			builtin_block_type_is_required = true;
	});

	// Very particular use of the soft loop lock.
	// align_struct may need to create custom types on the fly, but we don't care about
	// these types for purpose of iterating over them in ir.ids_for_type and friends.
	auto loop_lock = ir.create_loop_soft_lock();

	// Physical storage buffer pointers can have cyclical references,
	// so emit forward declarations of them before other structs.
	// Ignore type_id because we want the underlying struct type from the pointer.
	ir.for_each_typed_id<SPIRType>([&](uint32_t /* type_id */, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
			type.pointer && type.storage == StorageClassPhysicalStorageBuffer &&
			declared_structs.count(type.self) == 0)
		{
			statement("struct ", to_name(type.self), ";");
			declared_structs.insert(type.self);
			emitted = true;
		}
	});
	if (emitted)
		statement("");

	emitted = false;
	declared_structs.clear();

	// It is possible to have multiple spec constants that use the same spec constant ID.
	// The most common cause of this is defining spec constants in GLSL while also declaring
	// the workgroup size to use those spec constants. But, Metal forbids declaring more than
	// one variable with the same function constant ID.
	// In this case, we must only declare one variable with the [[function_constant(id)]]
	// attribute, and use its initializer to initialize all the spec constants with
	// that ID.
	std::unordered_map<uint32_t, ConstantID> unique_func_constants;

	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				// TODO: This can be expressed as a [[threads_per_threadgroup]] input semantic, but we need to know
				// the work group size at compile time in SPIR-V, and [[threads_per_threadgroup]] would need to be passed around as a global.
				// The work group size may be a specialization constant.
				statement("constant uint3 ", builtin_to_glsl(BuiltInWorkgroupSize, StorageClassWorkgroup),
				          " [[maybe_unused]] = ", constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				string sc_type_name = type_to_glsl(type);
				add_resource_name(c.self);
				string sc_name = to_name(c.self);

				// Function constants are only supported in MSL 1.2 and later.
				// If we don't support it just declare the "default" directly.
				// This "default" value can be overridden to the true specialization constant by the API user.
				// Specialization constants which are used as array length expressions cannot be function constants in MSL,
				// so just fall back to macros.
				if (msl_options.supports_msl_version(1, 2) && has_decoration(c.self, DecorationSpecId) &&
				    !c.is_used_as_array_length)
				{
					// Only scalar, non-composite values can be function constants.
					uint32_t constant_id = get_decoration(c.self, DecorationSpecId);
					if (!unique_func_constants.count(constant_id))
						unique_func_constants.insert(make_pair(constant_id, c.self));
					SPIRType::BaseType sc_tmp_type = expression_type(unique_func_constants[constant_id]).basetype;
					string sc_tmp_name = to_name(unique_func_constants[constant_id]) + "_tmp";
					if (unique_func_constants[constant_id] == c.self)
						statement("constant ", sc_type_name, " ", sc_tmp_name, " [[function_constant(", constant_id,
						          ")]];");
					statement("constant ", sc_type_name, " ", sc_name, " = is_function_constant_defined(", sc_tmp_name,
					          ") ? ", bitcast_expression(type, sc_tmp_type, sc_tmp_name), " : ", constant_expression(c),
					          ";");
				}
				else if (has_decoration(c.self, DecorationSpecId))
				{
					// Fallback to macro overrides.
					uint32_t constant_id = get_decoration(c.self, DecorationSpecId);
					c.specialization_constant_macro_name =
					    constant_value_macro_name(constant_id);

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("constant ", sc_type_name, " ", sc_name, " = ", c.specialization_constant_macro_name,
					          ";");

					// Record the usage of macro
					constant_macro_ids.insert(constant_id);
				}
				else
				{
					// Composite specialization constants must be built from other specialization constants.
					statement("constant ", sc_type_name, " ", sc_name, " = ", constant_expression(c), ";");
				}
				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("constant ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			// Output non-builtin interface structs. These include local function structs
			// and structs nested within uniform and read-write buffers.
			auto &type = id.get<SPIRType>();
			TypeID type_id = type.self;

			bool is_struct = (type.basetype == SPIRType::Struct) && type.array.empty() && !type.pointer;
			bool is_block =
			    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

			bool is_builtin_block = is_block && is_builtin_type(type);
			bool is_declarable_struct = is_struct && (!is_builtin_block || builtin_block_type_is_required);

			// We'll declare this later.
			if (stage_out_var_id && get_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_out_var_id && get_patch_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (stage_in_var_id && get_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_in_var_id && get_patch_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;

			// Special case. Declare builtin struct anyways if we need to emit a threadgroup version of it.
			if (stage_out_masked_builtin_type_id == type_id)
				is_declarable_struct = true;

			// Align and emit declarable structs...but avoid declaring each more than once.
			if (is_declarable_struct && declared_structs.count(type_id) == 0)
			{
				if (emitted)
					statement("");
				emitted = false;

				declared_structs.insert(type_id);

				if (has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
					align_struct(type, aligned_structs);

				// Make sure we declare the underlying struct type, and not the "decorated" type with pointers, etc.
				emit_struct(get<SPIRType>(type_id));
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			// Undefined global memory is not allowed in MSL.
			// Declare constant and init to zeros. Use {}, as global constructors can break Metal.
			statement(
			    inject_top_level_storage_qualifier(variable_decl(type, to_name(undef.self), undef.self), "constant"),
			    " = {};");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}